

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O2

void prompt_add(llama_tokens *prompt,llama_vocab *vocab,string *txt,bool add_special,
               bool parse_special)

{
  vector<int,_std::allocator<int>_> tmp;
  
  common_tokenize(&tmp,vocab,txt,add_special,true);
  prompt_add(prompt,&tmp);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tmp.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void prompt_add(llama_tokens & prompt, const llama_vocab * vocab, const std::string & txt, bool add_special, bool parse_special) {
    auto tmp = common_tokenize(vocab, txt, add_special, parse_special);
    prompt_add(prompt, tmp);
}